

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O3

int Nwk_NodeCompareLevelsIncrease(Nwk_Obj_t **pp1,Nwk_Obj_t **pp2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((*pp2)->Level <= (*pp1)->Level) {
    uVar1 = (uint)((*pp1)->Level != (*pp2)->Level);
  }
  return uVar1;
}

Assistant:

int Nwk_NodeCompareLevelsIncrease( Nwk_Obj_t ** pp1, Nwk_Obj_t ** pp2 )
{
    int Diff = (*pp1)->Level - (*pp2)->Level;
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}